

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboCompletenessTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles3::Functional::NumSamplesParams::getName_abi_cxx11_
          (string *__return_storage_ptr__,NumSamplesParams *this,NumSamplesParams *params)

{
  int iVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  char *pcVar5;
  ostringstream os;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  bVar2 = true;
  lVar4 = 0;
  do {
    if (!bVar2) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"_",1);
    }
    iVar1 = *(int *)((long)this->numSamples + lVar4);
    if (iVar1 == -2) {
      lVar3 = 4;
      pcVar5 = "none";
LAB_0129c101:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar5,lVar3);
    }
    else {
      if (iVar1 == -1) {
        lVar3 = 3;
        pcVar5 = "tex";
        goto LAB_0129c101;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"rbo",3);
      std::ostream::operator<<(local_1a8,*(int *)((long)this->numSamples + lVar4));
    }
    lVar4 = lVar4 + 4;
    bVar2 = false;
    if (lVar4 == 0xc) {
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

string NumSamplesParams::getName (const NumSamplesParams& params)
{
	ostringstream os;
	bool first = true;
	for (const GLsizei* ns	=	DE_ARRAY_BEGIN(params.numSamples);
		 ns					!=	DE_ARRAY_END(params.numSamples);
		 ns++)
	{
		if (first)
			first = false;
		else
			os << "_";

		if (*ns == SAMPLES_NONE)
			os << "none";
		else if (*ns == SAMPLES_TEXTURE)
			os << "tex";
		else
			os << "rbo" << *ns;
	}
	return os.str();
}